

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::WasmBytecodeGenerator
          (WasmBytecodeGenerator *this,ScriptContext *scriptContext,WasmReaderInfo *readerInfo,
          bool validateOnly)

{
  bool bVar1;
  uint uVar2;
  ThreadContext *this_00;
  PageAllocator *pageAllocator;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  IWasmByteCodeWriter *this_01;
  WasmFunctionInfo **ppWVar4;
  WebAssemblyModule **ppWVar5;
  WasmReaderBase *pWVar6;
  WasmByteCodeWriter *local_100;
  uint32 estimated;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  byte local_21;
  WasmReaderInfo *pWStack_20;
  bool validateOnly_local;
  WasmReaderInfo *readerInfo_local;
  ScriptContext *scriptContext_local;
  WasmBytecodeGenerator *this_local;
  
  this->opId = 0;
  this->lastOpId = 1;
  local_21 = validateOnly;
  pWStack_20 = readerInfo;
  readerInfo_local = (WasmReaderInfo *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  this_00 = Js::ScriptContext::GetThreadContext(scriptContext);
  pageAllocator = ThreadContext::GetPageAllocator(this_00);
  Memory::ArenaAllocator::ArenaAllocator
            (&this->m_alloc,L"WasmBytecodeGen",pageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  this->isUnreachable = false;
  this->m_scriptContext = (ScriptContext *)readerInfo_local;
  bVar1 = Simd::IsEnabled();
  WAsmJs::TypedRegisterAllocator::TypedRegisterAllocator
            (&this->mTypedRegisterAllocator,&this->m_alloc,AllocateRegisterSpace,
             ((byte)~bVar1 & 1) << 4);
  this->currentProfileId = 0;
  JsUtil::Stack<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Stack
            (&this->m_blockInfos,&this->m_alloc);
  JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Stack
            (&this->m_evalStack,&this->m_alloc);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&Js::EmptyWasmByteCodeWriter::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
             ,0x1f6);
  pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(&(this->m_alloc).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                          &local_60);
  local_70 = Memory::ArenaAllocator::Alloc;
  local_68 = 0;
  this_01 = (IWasmByteCodeWriter *)new<Memory::ArenaAllocator>(8,(ArenaAllocator *)pAVar3,0x3f67b0);
  memset(this_01,0,8);
  Js::EmptyWasmByteCodeWriter::EmptyWasmByteCodeWriter((EmptyWasmByteCodeWriter *)this_01);
  this->m_emptyWriter = this_01;
  if ((local_21 & 1) == 0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,(type_info *)&Js::WasmByteCodeWriter::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
               ,0x1f7);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(&(this->m_alloc).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,&local_98);
    local_100 = (WasmByteCodeWriter *)
                new<Memory::ArenaAllocator>(0x138,(ArenaAllocator *)pAVar3,0x3f67b0);
    memset(local_100,0,0x138);
    Js::WasmByteCodeWriter::WasmByteCodeWriter(local_100);
  }
  else {
    local_100 = (WasmByteCodeWriter *)this->m_emptyWriter;
  }
  this->m_originalWriter = &local_100->super_IWasmByteCodeWriter;
  this->m_writer = &local_100->super_IWasmByteCodeWriter;
  (**this->m_writer->_vptr_IWasmByteCodeWriter)();
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WasmFunctionInfo__
                      ((WriteBarrierPtr *)pWStack_20);
  this->m_funcInfo = *ppWVar4;
  ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WebAssemblyModule__
                      ((WriteBarrierPtr *)&pWStack_20->m_module);
  this->m_module = *ppWVar5;
  pWVar6 = GetReader(this);
  (**pWVar6->_vptr_WasmReaderBase)(pWVar6,this->m_funcInfo);
  pWVar6 = GetReader(this);
  uVar2 = (*pWVar6->_vptr_WasmReaderBase[4])();
  (*this->m_writer->_vptr_IWasmByteCodeWriter[5])(this->m_writer,&this->m_alloc,(ulong)uVar2);
  return;
}

Assistant:

WasmBytecodeGenerator::WasmBytecodeGenerator(Js::ScriptContext* scriptContext, WasmReaderInfo* readerInfo, bool validateOnly) :
    m_scriptContext(scriptContext),
    m_alloc(_u("WasmBytecodeGen"), scriptContext->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory),
    m_evalStack(&m_alloc),
    mTypedRegisterAllocator(&m_alloc, AllocateRegisterSpace, Simd::IsEnabled() ? 0 : 1 << WAsmJs::SIMD),
    m_blockInfos(&m_alloc),
    currentProfileId(0),
    isUnreachable(false)
{
    m_emptyWriter = Anew(&m_alloc, Js::EmptyWasmByteCodeWriter);
    m_writer = m_originalWriter = validateOnly ? m_emptyWriter : Anew(&m_alloc, Js::WasmByteCodeWriter);
    m_writer->Create();
    m_funcInfo = readerInfo->m_funcInfo;
    m_module = readerInfo->m_module;
    // Init reader to current func offset
    GetReader()->SeekToFunctionBody(m_funcInfo);

    const uint32 estimated = GetReader()->EstimateCurrentFunctionBytecodeSize();
    m_writer->InitData(&m_alloc, estimated);
}